

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert_manager.hpp
# Opt level: O3

void __thiscall
libtorrent::alert_manager::
emplace_alert<libtorrent::dht_put_alert,std::array<char,32ul>const&,std::array<char,64ul>const&,std::__cxx11::string,long_const&,int&>
          (alert_manager *this,array<char,_32UL> *args,array<char,_64UL> *args_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2,long *args_3,
          int *args_4)

{
  byte *pbVar1;
  int iVar2;
  type a;
  unique_lock<std::recursive_mutex> lock;
  unique_lock<std::recursive_mutex> local_40;
  
  local_40._M_owns = false;
  local_40._M_device = &this->m_mutex;
  std::unique_lock<std::recursive_mutex>::lock(&local_40);
  local_40._M_owns = true;
  iVar2 = this->m_generation;
  if ((this->m_alerts).super_array<libtorrent::heterogeneous_queue<libtorrent::alert>,_2UL>._M_elems
      [iVar2].m_num_items < this->m_queue_size_limit) {
    a = heterogeneous_queue<libtorrent::alert>::
        emplace_back<libtorrent::dht_put_alert,libtorrent::aux::stack_allocator&,std::array<char,32ul>const&,std::array<char,64ul>const&,std::__cxx11::string,long_const&,int&>
                  ((this->m_alerts).
                   super_array<libtorrent::heterogeneous_queue<libtorrent::alert>,_2UL>._M_elems +
                   iVar2,(this->m_allocations).super_array<libtorrent::aux::stack_allocator,_2UL>.
                         _M_elems + iVar2,args,args_1,args_2,args_3,args_4);
    maybe_notify(this,&a->super_alert);
  }
  else {
    pbVar1 = (byte *)((long)(this->m_dropped).super__Base_bitset<2UL>._M_w + 9);
    *pbVar1 = *pbVar1 | 0x10;
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_40);
  return;
}

Assistant:

void emplace_alert(Args&&... args) try
		{
			std::unique_lock<std::recursive_mutex> lock(m_mutex);

			// don't add more than this number of alerts, unless it's a
			// high priority alert, in which case we try harder to deliver it
			// for high priority alerts, double the upper limit
			if (m_alerts[m_generation].size() / (1 + T::priority)
				>= m_queue_size_limit)
			{
				// record that we dropped an alert of this type
				m_dropped.set(T::alert_type);
				return;
			}

			T& alert = m_alerts[m_generation].emplace_back<T>(
				m_allocations[m_generation], std::forward<Args>(args)...);

			maybe_notify(&alert);
		}
		catch (std::bad_alloc const&)
		{
			// record that we dropped an alert of this type
			std::unique_lock<std::recursive_mutex> lock(m_mutex);
			m_dropped.set(T::alert_type);
		}